

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lazy.h
# Opt level: O2

part_head_t * __thiscall
async_simple::coro::detail::LazyAwaiterBase<cinatra::part_head_t>::awaitResume
          (part_head_t *__return_storage_ptr__,LazyAwaiterBase<cinatra::part_head_t> *this)

{
  part_head_t *ppVar1;
  part_head_t r;
  part_head_t local_60;
  
  ppVar1 = LazyPromise<cinatra::part_head_t>::result
                     ((LazyPromise<cinatra::part_head_t> *)((long)(this->_handle).__handle_ + 0x10))
  ;
  cinatra::part_head_t::part_head_t(&local_60,ppVar1);
  (**(code **)((long)(this->_handle).__handle_ + 8))();
  (this->_handle).__handle_ = (void *)0x0;
  cinatra::part_head_t::part_head_t(__return_storage_ptr__,&local_60);
  cinatra::part_head_t::~part_head_t(&local_60);
  return __return_storage_ptr__;
}

Assistant:

auto awaitResume() {
        if constexpr (std::is_void_v<T>) {
            _handle.promise().result();
            // We need to destroy the handle expclictly since the awaited
            // coroutine after symmetric transfer couldn't release it self any
            // more.
            _handle.destroy();
            _handle = nullptr;
        } else {
            auto r = std::move(_handle.promise()).result();
            _handle.destroy();
            _handle = nullptr;
            return r;
        }
    }